

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O3

cTValue * str2num(cTValue *o,TValue *n)

{
  StrScanFmt SVar1;
  
  if ((0xfffefffe < (o->field_2).it) &&
     (((o->field_2).it != 0xfffffffb ||
      (SVar1 = lj_strscan_scan((uint8_t *)((ulong)(o->u32).lo + 0x10),n,2), o = n,
      SVar1 == STRSCAN_ERROR)))) {
    o = (cTValue *)0x0;
  }
  return o;
}

Assistant:

static cTValue *str2num(cTValue *o, TValue *n)
{
  if (tvisnum(o))
    return o;
  else if (tvisint(o))
    return (setnumV(n, (lua_Number)intV(o)), n);
  else if (tvisstr(o) && lj_strscan_num(strV(o), n))
    return n;
  else
    return NULL;
}